

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int dom_con_func_n(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  bitmap_t dst;
  bitmap_t bm1;
  uint uVar1;
  in_edge_t_conflict peVar2;
  
  dst = gen_ctx->temp_bitmap;
  bitmap_copy(dst,bb->dom_in);
  peVar2 = (bb->in_edges).head;
  bitmap_copy(bb->dom_in,peVar2->src->dom_out);
  while( true ) {
    peVar2 = (peVar2->in_link).next;
    bm1 = bb->dom_in;
    if (peVar2 == (in_edge_t)0x0) break;
    bitmap_and(bm1,bm1,peVar2->src->dom_out);
  }
  uVar1 = bitmap_equal_p(bm1,dst);
  return uVar1 ^ 1;
}

Assistant:

static int dom_con_func_n (gen_ctx_t gen_ctx, bb_t bb) {
  edge_t e, head;
  bitmap_t prev_dom_in = temp_bitmap;

  bitmap_copy (prev_dom_in, bb->dom_in);
  head = DLIST_HEAD (in_edge_t, bb->in_edges);
  bitmap_copy (bb->dom_in, head->src->dom_out);
  for (e = DLIST_NEXT (in_edge_t, head); e != NULL; e = DLIST_NEXT (in_edge_t, e))
    bitmap_and (bb->dom_in, bb->dom_in, e->src->dom_out); /* dom_in &= dom_out */
  return !bitmap_equal_p (bb->dom_in, prev_dom_in);
}